

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitWithSpacedVars_Test::TestBody
          (PrinterTest_EmitWithSpacedVars_Test *this)

{
  ZeroCopyOutputStream *output;
  char *message;
  long lVar1;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  allocator<char> local_403;
  allocator<char> local_402;
  allocator<char> local_401;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  Printer printer;
  AssertionResult gtest_ar;
  Sub local_1a0;
  Sub local_e8;
  
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer(&printer,output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"is_final",&local_401);
  Printer::Sub::Sub<char_const(&)[6]>((Sub *)&gtest_ar,&local_3a8,(char (*) [6])0xefea7b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"isnt_final",&local_402);
  message = anon_var_dwarf_651463 + 5;
  Printer::Sub::Sub<char_const(&)[1]>
            (&local_1a0,&local_3c8,(char (*) [1])(anon_var_dwarf_651463 + 5));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"class",&local_403);
  Printer::Sub::Sub<char_const(&)[4]>(&local_e8,&local_3e8,(char (*) [4])0xee5649);
  vars.len_ = 3;
  vars.ptr_ = (pointer)&gtest_ar;
  Printer::WithVars(&v,&printer,vars);
  lVar1 = 0x170;
  do {
    Printer::Sub::~Sub((Sub *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  Printer::Emit(&printer,0x47,
                "\n      public $is_final $class $class$ {\n        // Stuff.\n      }\n    ");
  Printer::Emit(&printer,0x49,
                "\n      public $isnt_final $class $class$ {\n        // Stuff.\n      }\n    ");
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v);
  Printer::~Printer(&printer);
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  printer.sink_.buffer_ = (this->super_PrinterTest).out_._M_dataplus._M_p;
  printer.sink_.stream_ = (ZeroCopyOutputStream *)(this->super_PrinterTest).out_._M_string_length;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[73]>
            ((internal *)&gtest_ar,"written()",
             "\"public final class Foo {\\n\" \"  // Stuff.\\n\" \"}\\n\" \"public class Foo {\\n\" \"  // Stuff.\\n\" \"}\\n\""
             ,(basic_string_view<char,_std::char_traits<char>_> *)&printer,
             (char (*) [73])
             "public final class Foo {\n  // Stuff.\n}\npublic class Foo {\n  // Stuff.\n}\n");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&printer);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x2b8,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v,(Message *)&printer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v);
    if (printer.sink_.stream_ != (ZeroCopyOutputStream *)0x0) {
      (*(printer.sink_.stream_)->_vptr_ZeroCopyOutputStream[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(PrinterTest, EmitWithSpacedVars) {
  {
    Printer printer(output());
    auto v = printer.WithVars({
        {"is_final", "final"},
        {"isnt_final", ""},
        {"class", "Foo"},
    });
    printer.Emit(R"java(
      public $is_final $class $class$ {
        // Stuff.
      }
    )java");
    printer.Emit(R"java(
      public $isnt_final $class $class$ {
        // Stuff.
      }
    )java");
  }

  EXPECT_EQ(written(),
            "public final class Foo {\n"
            "  // Stuff.\n"
            "}\n"
            "public class Foo {\n"
            "  // Stuff.\n"
            "}\n");
}